

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar UVar1;
  void *pvVar2;
  UChar *pUVar3;
  UBool UVar4;
  byte bVar5;
  int iVar6;
  int local_74;
  byte local_59;
  uint8_t cc;
  UChar c2;
  UChar *pUStack_58;
  uint8_t prevCC;
  UChar *prevBoundary;
  uint16_t norm16;
  UChar32 c;
  UChar *prevSrc;
  UChar32 minNoCP;
  UErrorCode *errorCode_local;
  ReorderingBuffer *buffer_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  UVar1 = this->minDecompNoCP;
  buffer_local = (ReorderingBuffer *)limit;
  limit_local = src;
  if (limit == (UChar *)0x0) {
    limit_local = copyLowPrefixFromNulTerminated(this,src,(uint)(ushort)UVar1,buffer,errorCode);
    UVar4 = ::U_FAILURE(*errorCode);
    if (UVar4 != '\0') {
      return limit_local;
    }
    buffer_local = (ReorderingBuffer *)u_strchr_63(limit_local,L'\0');
  }
  prevBoundary._4_4_ = 0;
  prevBoundary._2_2_ = 0;
  pUStack_58 = limit_local;
  local_59 = 0;
  pUVar3 = limit_local;
LAB_0033381a:
  if ((ReorderingBuffer *)limit_local != buffer_local) {
    prevBoundary._4_4_ = (uint)(ushort)*limit_local;
    if ((ushort)UVar1 <= prevBoundary._4_4_) {
      prevBoundary._2_2_ =
           *(uint16_t *)
            ((long)(this->normTrie->data).ptr0 +
            (long)(int)((uint)this->normTrie->index[(int)prevBoundary._4_4_ >> 6] +
                       (prevBoundary._4_4_ & 0x3f)) * 2);
      UVar4 = isMostDecompYesAndZeroCC(this,prevBoundary._2_2_);
      if (UVar4 == '\0') {
        if ((prevBoundary._4_4_ & 0xfffffc00) == 0xd800) {
          if (((ReorderingBuffer *)(limit_local + 1) == buffer_local) ||
             ((limit_local[1] & 0xfc00U) != 0xdc00)) {
            limit_local = limit_local + 1;
          }
          else {
            prevBoundary._4_4_ =
                 prevBoundary._4_4_ * 0x400 + (uint)(ushort)limit_local[1] + 0xfca02400;
            pvVar2 = (this->normTrie->data).ptr0;
            if ((int)prevBoundary._4_4_ < this->normTrie->highStart) {
              local_74 = ucptrie_internalSmallIndex_63(this->normTrie,prevBoundary._4_4_);
            }
            else {
              local_74 = this->normTrie->dataLength + -2;
            }
            prevBoundary._2_2_ = *(uint16_t *)((long)pvVar2 + (long)local_74 * 2);
            UVar4 = isMostDecompYesAndZeroCC(this,prevBoundary._2_2_);
            if (UVar4 == '\0') goto LAB_0033396c;
            limit_local = limit_local + 2;
          }
          goto LAB_0033381a;
        }
        goto LAB_0033396c;
      }
    }
    limit_local = limit_local + 1;
    goto LAB_0033381a;
  }
LAB_0033396c:
  if (limit_local != pUVar3) {
    if (buffer == (ReorderingBuffer *)0x0) {
      local_59 = 0;
      pUStack_58 = limit_local;
    }
    else {
      UVar4 = ReorderingBuffer::appendZeroCC(buffer,pUVar3,limit_local,errorCode);
      if (UVar4 == '\0') {
        return limit_local;
      }
    }
  }
  if ((ReorderingBuffer *)limit_local == buffer_local) {
    return limit_local;
  }
  iVar6 = 2;
  if (prevBoundary._4_4_ < 0x10000) {
    iVar6 = 1;
  }
  limit_local = limit_local + iVar6;
  pUVar3 = limit_local;
  if (buffer == (ReorderingBuffer *)0x0) {
    UVar4 = isDecompYes(this,prevBoundary._2_2_);
    if ((UVar4 == '\0') ||
       ((bVar5 = getCCFromYesOrMaybe(prevBoundary._2_2_), bVar5 < local_59 && (bVar5 != 0)))) {
      return pUStack_58;
    }
    local_59 = bVar5;
    if (bVar5 < 2) {
      pUStack_58 = limit_local;
    }
  }
  else {
    UVar4 = decompose(this,prevBoundary._4_4_,prevBoundary._2_2_,buffer,errorCode);
    if (UVar4 == '\0') {
      return limit_local;
    }
  }
  goto LAB_0033381a;
}

Assistant:

const UChar *
Normalizer2Impl::decompose(const UChar *src, const UChar *limit,
                           ReorderingBuffer *buffer,
                           UErrorCode &errorCode) const {
    UChar32 minNoCP=minDecompNoCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        limit=u_strchr(src, 0);
    }

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t norm16=0;

    // only for quick check
    const UChar *prevBoundary=src;
    uint8_t prevCC=0;

    for(;;) {
        // count code units below the minimum or with irrelevant data for the quick check
        for(prevSrc=src; src!=limit;) {
            if( (c=*src)<minNoCP ||
                isMostDecompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else if(!U16_IS_LEAD(c)) {
                break;
            } else {
                UChar c2;
                if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                    c=U16_GET_SUPPLEMENTARY(c, c2);
                    norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                    if(isMostDecompYesAndZeroCC(norm16)) {
                        src+=2;
                    } else {
                        break;
                    }
                } else {
                    ++src;  // unpaired lead surrogate: inert
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL) {
                if(!buffer->appendZeroCC(prevSrc, src, errorCode)) {
                    break;
                }
            } else {
                prevCC=0;
                prevBoundary=src;
            }
        }
        if(src==limit) {
            break;
        }

        // Check one above-minimum, relevant code point.
        src+=U16_LENGTH(c);
        if(buffer!=NULL) {
            if(!decompose(c, norm16, *buffer, errorCode)) {
                break;
            }
        } else {
            if(isDecompYes(norm16)) {
                uint8_t cc=getCCFromYesOrMaybe(norm16);
                if(prevCC<=cc || cc==0) {
                    prevCC=cc;
                    if(cc<=1) {
                        prevBoundary=src;
                    }
                    continue;
                }
            }
            return prevBoundary;  // "no" or cc out of order
        }
    }
    return src;
}